

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmlookup.cpp
# Opt level: O1

int __thiscall
CVmObjLookupTable::getp_count_buckets
          (CVmObjLookupTable *this,vm_obj_id_t self,vm_val_t *retval,uint *argc)

{
  vm_obj_id_t vVar1;
  int iVar2;
  
  if (getp_count_buckets(unsigned_int,vm_val_t*,unsigned_int*)::desc == '\0') {
    getp_count_buckets();
  }
  iVar2 = CVmObject::get_prop_check_argc(retval,argc,&getp_count_buckets::desc);
  if (iVar2 == 0) {
    vVar1 = *(vm_obj_id_t *)(this->super_CVmObjCollection).super_CVmObject.ext_;
    retval->typ = VM_INT;
    (retval->val).obj = vVar1;
  }
  return 1;
}

Assistant:

int CVmObjLookupTable::getp_count_buckets(VMG_ vm_obj_id_t self,
                                          vm_val_t *retval, uint *argc)
{
    static CVmNativeCodeDesc desc(0);

    /* check arguments */
    if (get_prop_check_argc(retval, argc, &desc))
        return TRUE;

    /* return the number of buckets */
    retval->set_int(get_bucket_count());

    /* handled */
    return TRUE;
}